

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O1

void sigopcount_tests::BuildTxs
               (CMutableTransaction *spendingTx,CCoinsViewCache *coins,
               CMutableTransaction *creationTx,CScript *scriptPubKey,CScript *scriptSig,
               CScriptWitness *witness)

{
  uchar *puVar1;
  pointer pCVar2;
  pointer pCVar3;
  long in_FS_OFFSET;
  CTransaction local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  creationTx->version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&creationTx->vin,1);
  pCVar2 = (creationTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (uchar *)((long)&(pCVar2->prevout).hash + 0x10);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1 = (uchar *)((long)&(pCVar2->prevout).hash + 0x18);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  *(undefined8 *)&(pCVar2->prevout).hash = 0;
  puVar1 = (uchar *)((long)&(pCVar2->prevout).hash + 8);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  (pCVar2->prevout).n = 0xffffffff;
  pCVar2 = (creationTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0x1c < *(size_type *)((long)&(pCVar2->scriptSig).super_CScriptBase + 0x1c)) {
    free(*(void **)&(pCVar2->scriptSig).super_CScriptBase._union);
  }
  *(undefined8 *)((long)&(pCVar2->scriptSig).super_CScriptBase + 0x10) = 0;
  *(undefined8 *)((long)&(pCVar2->scriptSig).super_CScriptBase + 0x18) = 0;
  *(undefined8 *)&(pCVar2->scriptSig).super_CScriptBase._union = 0;
  *(undefined8 *)((long)&(pCVar2->scriptSig).super_CScriptBase + 8) = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&creationTx->vout,1);
  pCVar3 = (creationTx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3->nValue = 1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar3->scriptPubKey).super_CScriptBase,&scriptPubKey->super_CScriptBase);
  spendingTx->version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&spendingTx->vin,1);
  CMutableTransaction::GetHash((Txid *)&local_b8,creationTx);
  pCVar2 = (spendingTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(pointer *)((long)&(pCVar2->prevout).hash + 0x10) =
       local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(pointer *)((long)&(pCVar2->prevout).hash + 0x18) =
       local_b8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)&(pCVar2->prevout).hash =
       local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)&(pCVar2->prevout).hash + 8) =
       local_b8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pCVar2 = (spendingTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar2->prevout).n = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar2->scriptSig).super_CScriptBase,&scriptSig->super_CScriptBase);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&(((spendingTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&witness->stack);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&spendingTx->vout,1);
  pCVar3 = (spendingTx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3->nValue = 1;
  if (0x1c < (pCVar3->scriptPubKey).super_CScriptBase._size) {
    free((pCVar3->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
  }
  *(undefined8 *)((long)&(pCVar3->scriptPubKey).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(pCVar3->scriptPubKey).super_CScriptBase._union + 0x18) = 0;
  (pCVar3->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(pCVar3->scriptPubKey).super_CScriptBase._union + 8) = 0;
  CTransaction::CTransaction(&local_b8,creationTx);
  AddCoins(coins,&local_b8,0,false);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b8.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void BuildTxs(CMutableTransaction& spendingTx, CCoinsViewCache& coins, CMutableTransaction& creationTx, const CScript& scriptPubKey, const CScript& scriptSig, const CScriptWitness& witness)
{
    creationTx.version = 1;
    creationTx.vin.resize(1);
    creationTx.vin[0].prevout.SetNull();
    creationTx.vin[0].scriptSig = CScript();
    creationTx.vout.resize(1);
    creationTx.vout[0].nValue = 1;
    creationTx.vout[0].scriptPubKey = scriptPubKey;

    spendingTx.version = 1;
    spendingTx.vin.resize(1);
    spendingTx.vin[0].prevout.hash = creationTx.GetHash();
    spendingTx.vin[0].prevout.n = 0;
    spendingTx.vin[0].scriptSig = scriptSig;
    spendingTx.vin[0].scriptWitness = witness;
    spendingTx.vout.resize(1);
    spendingTx.vout[0].nValue = 1;
    spendingTx.vout[0].scriptPubKey = CScript();

    AddCoins(coins, CTransaction(creationTx), 0);
}